

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

void __thiscall
SimpleBVH::BVH::get_nearest_facet_hint
          (BVH *this,VectorMax3d *p,int *nearest_f,VectorMax3d *nearest_point,double *sq_dist)

{
  int iVar1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  *other;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  RealScalar RVar7;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_90;
  LhsNested local_78;
  ulong local_70;
  double local_68;
  double *local_60;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  *local_58;
  int *local_50;
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *local_48;
  BVH *local_40;
  uint local_34;
  
  uVar2 = (uint)this->n_corners;
  iVar5 = 1;
  uVar4 = 0;
  local_60 = sq_dist;
  local_58 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)nearest_point;
  local_50 = nearest_f;
  local_48 = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)p;
  local_40 = this;
  while (iVar1 = (int)uVar4, uVar2 != iVar1 + 1U) {
    uVar3 = (int)(uVar2 - iVar1) / 2 + iVar1;
    iVar1 = iVar5 * 2;
    iVar5 = iVar5 * 2 + 1;
    local_70 = uVar4;
    local_34 = uVar2;
    local_68 = anon_unknown_6::point_box_center_squared_distance
                         (p,(this->boxlist).
                            super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar1);
    dVar6 = anon_unknown_6::point_box_center_squared_distance
                      (p,(this->boxlist).
                         super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar5);
    uVar2 = local_34;
    if (local_68 < dVar6) {
      uVar2 = uVar3;
      iVar5 = iVar1;
    }
    if (local_68 < dVar6) {
      uVar3 = (uint)local_70;
    }
    uVar4 = (ulong)uVar3;
  }
  *local_50 = iVar1;
  point_callback((VectorMax3d *)&local_90,local_40,
                 (local_40->new2old).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1]);
  other = local_58;
  if ((&local_90 != local_58) && (local_58[1].m_lhs = local_78, local_78 != (LhsNested)0x0)) {
    memcpy(local_58,&local_90,(long)local_78 << 3);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            (&local_90,local_48,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)other);
  RVar7 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                         *)&local_90);
  *local_60 = RVar7;
  return;
}

Assistant:

void BVH::get_nearest_facet_hint(
    const VectorMax3d& p,
    int& nearest_f,
    VectorMax3d& nearest_point,
    double& sq_dist) const
{
    int b = 0;
    int e = n_corners;
    int n = 1;
    while (e != b + 1) {
        int m = b + (e - b) / 2;
        int childl = 2 * n;
        int childr = 2 * n + 1;
        if (point_box_center_squared_distance(p, boxlist[childl])
            < point_box_center_squared_distance(p, boxlist[childr])) {
            e = m;
            n = childl;
        } else {
            b = m;
            n = childr;
        }
    }
    nearest_f = b;

    nearest_point = point_callback(new2old[nearest_f]);
    sq_dist = (p - nearest_point).squaredNorm();
}